

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

void __thiscall
Js::CompoundString::CompoundString
          (CompoundString *this,CharCount initialBlockSize,bool allocateBlock,
          JavascriptLibrary *library)

{
  Type *this_00;
  Block *pBVar1;
  code *pcVar2;
  Type TVar3;
  bool bVar4;
  StaticType *type;
  undefined4 *puVar5;
  Block *pBVar6;
  undefined7 in_register_00000011;
  
  type = StringCache::GetStringTypeStatic(&library->stringCache);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014f1da8;
  this_00 = &this->lastBlockInfo;
  BlockInfo::BlockInfo(this_00);
  this->directCharLength = 0xffffffff;
  this->ownsLastBlock = true;
  (this->lastBlock).ptr = (Block *)0x0;
  if ((int)CONCAT71(in_register_00000011,allocateBlock) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1d9,"(allocateBlock)","allocateBlock");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pBVar6 = Block::New(initialBlockSize,(Block *)0x0,library->recycler);
  pBVar1 = (pBVar6->bufferOwner).ptr;
  Memory::Recycler::WBSetBit((char *)this_00);
  (this->lastBlockInfo).buffer.ptr = pBVar1 + 1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this_00);
  TVar3 = pBVar6->charCapacity;
  (this->lastBlockInfo).charLength = pBVar6->charLength;
  (this->lastBlockInfo).charCapacity = TVar3;
  Memory::Recycler::WBSetBit((char *)&this->lastBlock);
  (this->lastBlock).ptr = pBVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastBlock);
  return;
}

Assistant:

CompoundString::CompoundString(
        const CharCount initialBlockSize,
        const bool allocateBlock,
        JavascriptLibrary *const library)
        : LiteralString(library->GetStringTypeStatic()),
        directCharLength(static_cast<CharCount>(-1)),
        ownsLastBlock(true)
    {
        Assert(allocateBlock);
        Assert(library);

        Block *const block = Block::New(initialBlockSize, nullptr, library->GetRecycler());
        lastBlockInfo.CopyFrom(block);
        lastBlock = block;
    }